

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O3

void mjs::accept<mjs::hoisting_visitor>(statement *s,hoisting_visitor *v)

{
  element_type *peVar1;
  int iVar2;
  long lVar3;
  uint32_t *puVar4;
  unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *bs;
  element_type *peVar5;
  
  do {
    iVar2 = (*(((function_definition *)s)->super_statement).super_syntax_node._vptr_syntax_node[3])
                      (s);
    lVar3 = 0x28;
    switch(iVar2) {
    case 0:
      peVar1 = (element_type *)
               (((function_definition *)s)->super_function_base).body_extend_.file.
               super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      for (peVar5 = (((function_definition *)s)->super_function_base).body_extend_.file.
                    super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          peVar5 != peVar1; peVar5 = (element_type *)&peVar5->filename_) {
        accept<mjs::hoisting_visitor>(*(statement **)&peVar5->ver_,v);
      }
      return;
    case 1:
      peVar1 = (element_type *)
               (((function_definition *)s)->super_function_base).body_extend_.file.
               super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      for (peVar5 = (((function_definition *)s)->super_function_base).body_extend_.file.
                    super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          peVar5 != peVar1; peVar5 = (element_type *)&peVar5->text_) {
        std::
        vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::push_back(&v->ids_,(value_type *)peVar5);
      }
    case 2:
    case 3:
    case 4:
    case 10:
    case 0xb:
    case 0xc:
    case 0x10:
      return;
    case 5:
      hoisting_visitor::operator()(v,(if_statement *)s);
      return;
    case 8:
      hoisting_visitor::operator()(v,(for_statement *)s);
      return;
    case 9:
      accept<mjs::hoisting_visitor>
                ((statement *)
                 (((function_definition *)s)->super_function_base).body_extend_.file.
                 super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr,v);
      puVar4 = &(((function_definition *)s)->super_function_base).body_extend_.start;
      break;
    case 0xe:
      lVar3 = 0x40;
    case 6:
    case 7:
    case 0xd:
      puVar4 = (uint32_t *)
               ((long)&(((function_definition *)s)->super_statement).super_syntax_node.
                       _vptr_syntax_node + lVar3);
      break;
    case 0xf:
      hoisting_visitor::operator()(v,(switch_statement *)s);
      return;
    case 0x11:
      hoisting_visitor::operator()(v,(try_statement *)s);
      return;
    case 0x12:
      hoisting_visitor::operator()(v,(function_definition *)s);
      return;
    default:
      __assert_fail("!\"Not implemented\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h"
                    ,0x3d6,
                    "auto mjs::accept(const statement &, Visitor &) [Visitor = mjs::hoisting_visitor]"
                   );
    }
    s = *(statement **)puVar4;
  } while( true );
}

Assistant:

auto accept(const statement& s, Visitor& v) {
    switch (s.type()) {
    case statement_type::block:                 return v(static_cast<const block_statement&>(s));
    case statement_type::variable:              return v(static_cast<const variable_statement&>(s));
    case statement_type::debugger:              return v(static_cast<const debugger_statement&>(s));
    case statement_type::empty:                 return v(static_cast<const empty_statement&>(s));
    case statement_type::expression:            return v(static_cast<const expression_statement&>(s));
    case statement_type::if_:                   return v(static_cast<const if_statement&>(s));
    case statement_type::do_:                   return v(static_cast<const do_statement&>(s));
    case statement_type::while_:                return v(static_cast<const while_statement&>(s));
    case statement_type::for_:                  return v(static_cast<const for_statement&>(s));
    case statement_type::for_in:                return v(static_cast<const for_in_statement&>(s));
    case statement_type::continue_:             return v(static_cast<const continue_statement&>(s));
    case statement_type::break_:                return v(static_cast<const break_statement&>(s));
    case statement_type::return_:               return v(static_cast<const return_statement&>(s));
    case statement_type::with:                  return v(static_cast<const with_statement&>(s));
    case statement_type::labelled:              return v(static_cast<const labelled_statement&>(s));
    case statement_type::switch_:               return v(static_cast<const switch_statement&>(s));
    case statement_type::throw_:                return v(static_cast<const throw_statement&>(s));
    case statement_type::try_:                  return v(static_cast<const try_statement&>(s));
    case statement_type::function_definition:   return v(static_cast<const function_definition&>(s));
    }
    assert(!"Not implemented");
    return v(s);
}